

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O3

int __thiscall
NNTreeImpl::compareKeyItem(NNTreeImpl *this,QPDFObjectHandle *key,QPDFObjectHandle *items,int idx)

{
  NNTreeDetails *pNVar1;
  QPDF *qpdf;
  uint __val;
  uint uVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  long *plVar6;
  undefined8 extraout_RAX;
  uint uVar7;
  long *plVar8;
  size_type *psVar9;
  ulong uVar10;
  uint __len;
  uint uVar11;
  QPDFObjectHandle QVar12;
  string __str;
  element_type *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  QPDFObjectHandle local_b0;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  string local_80;
  QPDFObjectHandle local_60;
  long *local_50 [2];
  long local_40 [2];
  
  bVar3 = QPDFObjectHandle::isArray(items);
  if ((bVar3) && (iVar5 = QPDFObjectHandle::getArrayNItems(items), idx * 2 < iVar5)) {
    pNVar1 = this->details;
    QVar12 = QPDFObjectHandle::getArrayItem(&local_60,(int)items);
    cVar4 = (**(code **)(*(long *)pNVar1 + 8))
                      (pNVar1,&local_60,
                       QVar12.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
    if (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (cVar4 != '\0') {
      pNVar1 = this->details;
      local_c0 = (key->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_b8 = (key->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_b8->_M_use_count = local_b8->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_b8->_M_use_count = local_b8->_M_use_count + 1;
        }
      }
      QPDFObjectHandle::getArrayItem(&local_b0,(int)items);
      iVar5 = (**(code **)(*(long *)pNVar1 + 0x10))(pNVar1,&local_c0,&local_b0);
      if (local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
      }
      return iVar5;
    }
  }
  uVar11 = idx * 2;
  __val = idx * -2;
  if (idx * -2 < 0) {
    __val = uVar11;
  }
  __len = 1;
  if (9 < __val) {
    uVar10 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar7 = (uint)uVar10;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_00131535;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_00131535;
      }
      if (uVar7 < 10000) goto LAB_00131535;
      uVar10 = uVar10 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_00131535:
  qpdf = this->qpdf;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)((int)uVar11 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar11 >> 0x1f) + (long)local_50[0]),__len,__val);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x262e07);
  local_a0 = (long *)*plVar6;
  plVar8 = plVar6 + 2;
  if (local_a0 == plVar8) {
    local_90 = *plVar8;
    lStack_88 = plVar6[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar8;
  }
  local_98 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_a0);
  local_80._M_dataplus._M_p = (pointer)*plVar6;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_80._M_dataplus._M_p == psVar9) {
    local_80.field_2._M_allocated_capacity = *psVar9;
    local_80.field_2._8_8_ = plVar6[3];
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar9;
  }
  local_80._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  ::error(qpdf,&this->oh,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
NNTreeImpl::compareKeyItem(QPDFObjectHandle& key, QPDFObjectHandle& items, int idx)
{
    if (!((items.isArray() && (items.getArrayNItems() > (2 * idx)) &&
           details.keyValid(items.getArrayItem(2 * idx))))) {
        QTC::TC("qpdf", "NNTree item is wrong type");
        error(
            qpdf,
            this->oh,
            ("item at index " + std::to_string(2 * idx) + " is not the right type"));
    }
    return details.compareKeys(key, items.getArrayItem(2 * idx));
}